

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

appender fmt::v9::detail::write_codepoint<4ul,char,fmt::v9::appender>
                   (appender out,char prefix,uint32_t cp)

{
  back_insert_iterator<fmt::v9::detail::buffer<char>_> *pbVar1;
  appender aVar2;
  char local_44 [4];
  back_insert_iterator<fmt::v9::detail::buffer<char>_> bStack_40;
  char buf [4];
  char local_31;
  back_insert_iterator<fmt::v9::detail::buffer<char>_> local_30;
  value_type local_21;
  uint32_t local_20;
  char local_19;
  uint32_t cp_local;
  char prefix_local;
  appender out_local;
  
  local_21 = '\\';
  local_20 = cp;
  local_19 = prefix;
  _cp_local = out.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container;
  local_30.container = (buffer<char> *)appender::operator++((appender *)&cp_local,0);
  pbVar1 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*(&local_30);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar1,&local_21);
  local_31 = local_19;
  bStack_40.container = (buffer<char> *)appender::operator++((appender *)&cp_local,0);
  pbVar1 = std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator*
                     (&stack0xffffffffffffffc0);
  std::back_insert_iterator<fmt::v9::detail::buffer<char>_>::operator=(pbVar1,&local_31);
  fill_n<char,unsigned_long>(local_44,4,'0');
  format_uint<4u,char,unsigned_int>(local_44,local_20,4,false);
  aVar2 = copy_str<char,char*>(local_44,(char *)&stack0xffffffffffffffc0,(appender)_cp_local);
  return (appender)
         aVar2.super_back_insert_iterator<fmt::v9::detail::buffer<char>_>.container.container;
}

Assistant:

auto write_codepoint(OutputIt out, char prefix, uint32_t cp) -> OutputIt {
  *out++ = static_cast<Char>('\\');
  *out++ = static_cast<Char>(prefix);
  Char buf[width];
  fill_n(buf, width, static_cast<Char>('0'));
  format_uint<4>(buf, cp, width);
  return copy_str<Char>(buf, buf + width, out);
}